

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>::grow
          (SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false> *this,size_t MinSize)

{
  uint uVar1;
  move_iterator<llvm::DWARFDebugLoc::Entry_*> __first;
  ulong uVar2;
  Entry *__result;
  ulong uVar3;
  size_t __n;
  SmallVectorBase *__src;
  SmallVectorBase *this_00;
  SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false> *__ptr;
  void *pvVar4;
  long lVar5;
  
  if (MinSize >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar2 = (ulong)(this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).
                 super_SmallVectorBase.Capacity + 2;
  uVar3 = uVar2 >> 1 | uVar2;
  uVar3 = uVar3 >> 2 | uVar3;
  uVar3 = uVar3 >> 4 | uVar3;
  uVar3 = uVar3 >> 8 | uVar3;
  uVar2 = (uVar2 >> 0x20 | uVar3 >> 0x10 | uVar3) + 1;
  if (uVar2 <= MinSize) {
    uVar2 = MinSize;
  }
  if (0xfffffffe < uVar2) {
    uVar2 = 0xffffffff;
  }
  this_00 = (SmallVectorBase *)(uVar2 * 0x28);
  __result = (Entry *)malloc((size_t)this_00);
  if (__result != (Entry *)0x0) {
    __first._M_current =
         (Entry *)(this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).
                  super_SmallVectorBase.BeginX;
    std::__uninitialized_copy<false>::
    __uninit_copy<std::move_iterator<llvm::DWARFDebugLoc::Entry*>,llvm::DWARFDebugLoc::Entry*>
              (__first,__first._M_current +
                       (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).
                       super_SmallVectorBase.Size,__result);
    __ptr = (SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false> *)
            (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).
            super_SmallVectorBase.BeginX;
    uVar3 = (ulong)(this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).
                   super_SmallVectorBase.Size;
    if (uVar3 != 0) {
      pvVar4 = (void *)((long)__ptr + uVar3 * 0x28 + -8);
      lVar5 = uVar3 * -0x28;
      do {
        if (pvVar4 != *(void **)((long)pvVar4 + -0x10)) {
          free(*(void **)((long)pvVar4 + -0x10));
        }
        pvVar4 = (void *)((long)pvVar4 + -0x28);
        lVar5 = lVar5 + 0x28;
      } while (lVar5 != 0);
      __ptr = (SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false> *)
              (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).
              super_SmallVectorBase.BeginX;
    }
    if (__ptr != this + 1) {
      free(__ptr);
    }
    (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).super_SmallVectorBase.
    BeginX = __result;
    (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).super_SmallVectorBase.
    Capacity = (uint)uVar2;
    return;
  }
  SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,false>::grow();
  if (this_00 == (SmallVectorBase *)MinSize) {
    return;
  }
  __src = (SmallVectorBase *)((SmallVectorBase *)MinSize)->BeginX;
  if (__src != (SmallVectorBase *)(MinSize + 0x10)) {
    if ((SmallVectorBase *)this_00->BeginX != this_00 + 1) {
      free((SmallVectorBase *)this_00->BeginX);
      __src = (SmallVectorBase *)((SmallVectorBase *)MinSize)->BeginX;
    }
    this_00->BeginX = __src;
    uVar1 = ((SmallVectorBase *)MinSize)->Capacity;
    this_00->Size = ((SmallVectorBase *)MinSize)->Size;
    this_00->Capacity = uVar1;
    ((SmallVectorBase *)MinSize)->BeginX = (SmallVectorBase *)(MinSize + 0x10);
    ((SmallVectorBase *)MinSize)->Capacity = 0;
    goto LAB_00d6a898;
  }
  uVar1 = ((SmallVectorBase *)MinSize)->Size;
  uVar2 = (ulong)this_00->Size;
  if (this_00->Size < uVar1) {
    if (this_00->Capacity < uVar1) {
      this_00->Size = 0;
      SmallVectorBase::grow_pod(this_00,this_00 + 1,(ulong)uVar1,1);
LAB_00d6a871:
      uVar2 = 0;
    }
    else {
      if (uVar2 == 0) goto LAB_00d6a871;
      memmove(this_00->BeginX,__src,uVar2);
    }
    __n = ((SmallVectorBase *)MinSize)->Size - uVar2;
    if (__n != 0) {
      memcpy((void *)(uVar2 + (long)this_00->BeginX),
             (void *)((long)((SmallVectorBase *)MinSize)->BeginX + uVar2),__n);
    }
  }
  else if (uVar1 != 0) {
    memmove(this_00->BeginX,__src,(ulong)uVar1);
  }
  if (this_00->Capacity < uVar1) {
    __assert_fail("N <= capacity()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                  ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
  }
  this_00->Size = uVar1;
LAB_00d6a898:
  ((SmallVectorBase *)MinSize)->Size = 0;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}